

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testopal.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  Am_Slot_Key AVar1;
  ushort uVar2;
  ushort uVar3;
  Am_Wrapper *pAVar4;
  Am_Object *pAVar5;
  Am_Method_Wrapper *pAVar6;
  Am_Constraint *pAVar7;
  Am_Object AVar8;
  Am_Object AVar9;
  ostream *poVar10;
  Am_Object AVar11;
  Am_Object AVar12;
  Am_Object AVar13;
  Am_Object AVar14;
  Am_Object AVar15;
  Am_Object AVar16;
  Am_Object AVar17;
  Am_Object AVar18;
  Am_Object local_1e8;
  Am_Object local_1e0;
  Am_Object local_1d8;
  Am_Object noo_group;
  Am_Object local_1c8;
  Am_Object local_1c0;
  Am_Object foo_group;
  Am_Object local_1b0;
  Am_Object local_1a8;
  Am_Object local_1a0;
  Am_Object local_198;
  int local_190;
  int local_18c;
  int y;
  int x;
  Am_Object local_180;
  Am_Object local_178;
  Am_Object object;
  Am_Object local_168;
  Am_Object local_160;
  Am_Object local_158;
  Am_Object local_150;
  Am_Object local_148;
  Am_Object local_140;
  Am_Object local_138;
  Am_Object local_130;
  Am_Object local_128;
  Am_Object local_120;
  Am_Object local_118;
  Am_Object local_110;
  Am_Object local_108;
  Am_Object local_100;
  Am_Object local_f8;
  Am_Object local_f0;
  Am_Object local_e8;
  Am_Object local_e0;
  Am_Object local_d8;
  Am_Object local_d0;
  Am_Object local_c8;
  Am_Object local_c0;
  Am_Object l2;
  Am_Image_Array local_b0 [8];
  Am_Style local_a8 [8];
  Am_Style thick_orange_line;
  Am_Object local_98;
  Am_Object local_90;
  Am_Object r3;
  Am_Image_Array local_80 [8];
  Am_Style local_78 [8];
  Am_Style bevel;
  Am_Point_List local_68 [8];
  Am_Point_List triangle;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38 [3];
  Am_Object local_20;
  char **local_18;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_18 = argv;
  argv_local._0_4_ = argc;
  Am_Initialize();
  Am_Object::Create((char *)&local_20);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Red);
  uVar2 = Am_Object::Set((ushort)&local_20,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  uVar2 = Am_Object::Set(uVar2,100,0x32);
  uVar2 = Am_Object::Set(uVar2,0x65,200);
  uVar2 = Am_Object::Set(uVar2,0x66,200);
  uVar2 = Am_Object::Set(uVar2,0x67,0xdc);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar2,(char *)0x6c,0x10a3e6);
  Am_Object::operator=(&window,pAVar5);
  Am_Object::~Am_Object(&local_20);
  Am_Object::Create((char *)local_38);
  Am_Object::operator=(&inter,local_38);
  Am_Object::~Am_Object(local_38);
  Am_Object::Set(0xd2e0,(char *)0xb9,0x10a3ff);
  Am_Object::Set(0xd2e0,0xcb,0);
  Am_Object::Get_Object((ushort)&local_40,0x10d2e0);
  pAVar6 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&change_setting);
  Am_Object::Set((ushort)&local_40,(Am_Method_Wrapper *)0xca,(ulong)pAVar6);
  Am_Object::~Am_Object(&local_40);
  AVar1 = KEY;
  Am_Object::Am_Object(&local_48,&inter);
  AVar8.data._2_6_ = 0;
  AVar8.data._0_2_ = AVar1;
  Am_Object::Add_Part(0xd2d8,AVar8,(ulong)&local_48);
  Am_Object::~Am_Object(&local_48);
  Am_Object::Create((char *)&local_50);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
  uVar2 = Am_Object::Set((ushort)&local_50,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  uVar2 = Am_Object::Set(uVar2,100,0x14);
  uVar2 = Am_Object::Set(uVar2,0x65,0x96);
  uVar2 = Am_Object::Set(uVar2,0x66,0x50);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar2,0x67,0x3c);
  Am_Object::operator=(&sw,pAVar5);
  Am_Object::~Am_Object(&local_50);
  Am_Object::Create((char *)&local_58);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Green);
  uVar2 = Am_Object::Set((ushort)&local_58,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  uVar2 = Am_Object::Set(uVar2,100,10);
  uVar2 = Am_Object::Set(uVar2,0x65,10);
  uVar2 = Am_Object::Set(uVar2,0x66,0xb4);
  uVar2 = Am_Object::Set(uVar2,0x67,0xb4);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)rect_width);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x66,(ulong)pAVar7);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)rect_height);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar2,(Am_Constraint *)0x67,(ulong)pAVar7);
  Am_Object::operator=(&r1,pAVar5);
  Am_Object::~Am_Object(&local_58);
  Am_Point_List::Am_Point_List(local_68,main::tria,8);
  Am_Object::Create((char *)&bevel);
  pAVar4 = Am_Point_List::operator_cast_to_Am_Wrapper_(local_68);
  pAVar5 = (Am_Object *)Am_Object::Set((ushort)&bevel,(Am_Wrapper *)0xb2,(ulong)pAVar4);
  Am_Object::operator=(&t1,pAVar5);
  Am_Object::~Am_Object((Am_Object *)&bevel);
  Am_Image_Array::Am_Image_Array(local_80,(Am_Image_Array *)&Am_No_Image);
  Am_Style::Am_Style((Am_Style *)0x0,0,local_78,0x1e,1,2,0,&Am_DEFAULT_DASH_LIST,2,0,0,local_80);
  Am_Image_Array::~Am_Image_Array(local_80);
  Am_Object::Create((char *)&r3);
  uVar2 = Am_Object::Set((ushort)&r3,100,0x14);
  uVar2 = Am_Object::Set(uVar2,0x65,0x14);
  uVar2 = Am_Object::Set(uVar2,0x66,0x78);
  uVar2 = Am_Object::Set(uVar2,0x67,0x5a);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(local_78);
  uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0x6b,(ulong)pAVar4);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  Am_Object::operator=(&r2,pAVar5);
  Am_Object::~Am_Object(&r3);
  Am_Object::Create((char *)&local_98);
  uVar2 = Am_Object::Add((ushort)&local_98,true,0);
  uVar2 = Am_Object::Add(uVar2,true,0);
  uVar2 = Am_Object::Set(uVar2,100,0x14);
  uVar2 = Am_Object::Set(uVar2,0x65,0x14);
  uVar2 = Am_Object::Set(uVar2,0x66,0x78);
  uVar2 = Am_Object::Set(uVar2,0x67,0x5a);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)rect_fill);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar2,(Am_Constraint *)0x6a,(ulong)pAVar7);
  Am_Object::Am_Object(&local_90,pAVar5);
  Am_Object::~Am_Object(&local_98);
  Am_Object::Create((char *)&thick_orange_line);
  uVar2 = Am_Object::Set((ushort)&thick_orange_line,100,10);
  uVar2 = Am_Object::Set(uVar2,0x65,10);
  uVar2 = Am_Object::Set(uVar2,0x66,0x3c);
  uVar2 = Am_Object::Set(uVar2,0x67,0x28);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_White);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  Am_Object::operator=(&r4,pAVar5);
  Am_Object::~Am_Object((Am_Object *)&thick_orange_line);
  Am_Image_Array::Am_Image_Array(local_b0,(Am_Image_Array *)&Am_No_Image);
  Am_Style::Am_Style((Am_Style *)0x3f400000,0x3e800000,0,local_a8,5,1,0,0,&Am_DEFAULT_DASH_LIST,2,0,
                     0,local_b0);
  Am_Image_Array::~Am_Image_Array(local_b0);
  Am_Object::Create((char *)&l2);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_(local_a8);
  uVar2 = Am_Object::Set((ushort)&l2,(Am_Wrapper *)0x6b,(ulong)pAVar4);
  uVar2 = Am_Object::Set(uVar2,0x8b,0x46);
  uVar2 = Am_Object::Set(uVar2,0x8c,0xf);
  uVar2 = Am_Object::Set(uVar2,0x8d,0x91);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar2,0x8e,0x91);
  Am_Object::operator=(&l1,pAVar5);
  Am_Object::~Am_Object(&l2);
  Am_Object::Create((char *)&local_c8);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)at_sw_x);
  uVar2 = Am_Object::Set((ushort)&local_c8,(Am_Constraint *)0x8b,(ulong)pAVar7);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)at_sw_y);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x8c,(ulong)pAVar7);
  uVar2 = Am_Object::Set(uVar2,0x8d,0x91);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar2,0x8e,0x55);
  Am_Object::Am_Object(&local_c0,pAVar5);
  Am_Object::~Am_Object(&local_c8);
  Am_Object::Create((char *)&local_d0);
  AVar1 = OOK;
  Am_Object::Create((char *)&local_e0);
  uVar2 = Am_Object::Set((ushort)&local_e0,100,0);
  uVar2 = Am_Object::Set(uVar2,0x65,0);
  uVar2 = Am_Object::Set(uVar2,0x66,0x32);
  uVar2 = Am_Object::Set(uVar2,0x67,0x1e);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_White);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  Am_Object::Am_Object(&local_d8,pAVar5);
  AVar9.data._2_6_ = 0;
  AVar9.data._0_2_ = AVar1;
  uVar2 = Am_Object::Add_Part((ushort)&local_d0,AVar9,(ulong)&local_d8);
  AVar1 = EEK_SLOT;
  Am_Object::Create((char *)&local_f0);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
  uVar3 = Am_Object::Set((ushort)&local_f0,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  uVar3 = Am_Object::Set(uVar3,100,5);
  uVar3 = Am_Object::Set(uVar3,0x65,5);
  uVar3 = Am_Object::Set(uVar3,0x66,0x32);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar3,0x67,0x1e);
  pAVar5 = (Am_Object *)Am_Object::operator=(&eek,pAVar5);
  Am_Object::Am_Object(&local_e8,pAVar5);
  AVar11.data._2_6_ = 0;
  AVar11.data._0_2_ = AVar1;
  uVar2 = Am_Object::Add_Part(uVar2,AVar11,(ulong)&local_e8);
  uVar2 = Am_Object::Set(uVar2,100,0x8c);
  uVar2 = Am_Object::Set(uVar2,0x65,0x96);
  uVar2 = Am_Object::Set(uVar2,0x66,0x37);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar2,0x67,0x23);
  Am_Object::operator=(&g1,pAVar5);
  Am_Object::~Am_Object(&local_e8);
  Am_Object::~Am_Object(&local_f0);
  Am_Object::~Am_Object(&local_d8);
  Am_Object::~Am_Object(&local_e0);
  Am_Object::~Am_Object(&local_d0);
  Am_Object::Am_Object(&local_f8,&window);
  Am_Object::Add_Part((Am_Object_Data *)&Am_Screen,SUB81(&local_f8,0),1);
  Am_Object::~Am_Object(&local_f8);
  AVar1 = PART1;
  Am_Object::Am_Object(&local_100,&r1);
  AVar12.data._2_6_ = 0;
  AVar12.data._0_2_ = AVar1;
  Am_Object::Add_Part(0xd2d8,AVar12,(ulong)&local_100);
  Am_Object::~Am_Object(&local_100);
  Am_Object::Am_Object(&local_108,&local_90);
  Am_Object::Add_Part((Am_Object)0x10d2d8,SUB81(&local_108,0),1);
  Am_Object::~Am_Object(&local_108);
  Am_Object::Am_Object(&local_110,&r2);
  Am_Object::Add_Part((Am_Object)0x10d2d8,SUB81(&local_110,0),1);
  Am_Object::~Am_Object(&local_110);
  AVar1 = LINE1;
  Am_Object::Am_Object(&local_118,&l1);
  AVar13.data._2_6_ = 0;
  AVar13.data._0_2_ = AVar1;
  Am_Object::Add_Part(0xd2d8,AVar13,(ulong)&local_118);
  Am_Object::~Am_Object(&local_118);
  Am_Object::Am_Object(&local_120,&local_c0);
  Am_Object::Add_Part((Am_Object)0x10d2d8,SUB81(&local_120,0),1);
  Am_Object::~Am_Object(&local_120);
  AVar1 = PART2;
  Am_Object::Am_Object(&local_128,&g1);
  AVar14.data._2_6_ = 0;
  AVar14.data._0_2_ = AVar1;
  Am_Object::Add_Part(0xd2d8,AVar14,(ulong)&local_128);
  Am_Object::~Am_Object(&local_128);
  AVar1 = PART3;
  Am_Object::Am_Object(&local_130,&sw);
  AVar15.data._2_6_ = 0;
  AVar15.data._0_2_ = AVar1;
  Am_Object::Add_Part(0xd2d8,AVar15,(ulong)&local_130);
  Am_Object::~Am_Object(&local_130);
  AVar1 = TRI1;
  Am_Object::Am_Object(&local_138,&t1);
  AVar16.data._2_6_ = 0;
  AVar16.data._0_2_ = AVar1;
  Am_Object::Add_Part(0xd2d8,AVar16,(ulong)&local_138);
  Am_Object::~Am_Object(&local_138);
  Am_Object::Am_Object(&local_140,&r4);
  Am_Object::Add_Part((Am_Object)0x10d2f8,SUB81(&local_140,0),1);
  Am_Object::~Am_Object(&local_140);
  Am_Object::Create((char *)&local_150);
  uVar2 = Am_Object::Set((ushort)&local_150,(char *)0x6c,0x10a44e);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
  uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  AVar8.data = (Am_Object_Data *)Am_Object::Set(uVar2,0x65,0x28);
  Am_Object::Create((char *)&local_160);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)win_parrot_left);
  uVar2 = Am_Object::Set((ushort)&local_160,(Am_Constraint *)0x64,(ulong)pAVar7);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)win_parrot_top);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x65,(ulong)pAVar7);
  uVar2 = Am_Object::Set(uVar2,0x66,500);
  AVar9.data = (Am_Object_Data *)Am_Object::Set(uVar2,0x67,500);
  Am_Object::Create((char *)&object);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Red);
  uVar2 = Am_Object::Set((ushort)&object,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  uVar2 = Am_Object::Set(uVar2,0x6b,0);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)parrot_left);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x64,(ulong)pAVar7);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)parrot_top);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x65,(ulong)pAVar7);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)parrot_width);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x66,(ulong)pAVar7);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)parrot_height);
  pAVar5 = (Am_Object *)Am_Object::Set(uVar2,(Am_Constraint *)0x67,(ulong)pAVar7);
  Am_Object::Am_Object(&local_168,pAVar5);
  pAVar5 = (Am_Object *)Am_Object::Add_Part(AVar9,SUB81(&local_168,0),1);
  Am_Object::Am_Object(&local_158,pAVar5);
  pAVar5 = (Am_Object *)Am_Object::Add_Part(AVar8,SUB81(&local_158,0),1);
  Am_Object::Am_Object(&local_148,pAVar5);
  Am_Object::Add_Part((Am_Object_Data *)&Am_Screen,SUB81(&local_148,0),1);
  Am_Object::~Am_Object(&local_148);
  Am_Object::~Am_Object(&local_158);
  Am_Object::~Am_Object(&local_168);
  Am_Object::~Am_Object(&object);
  Am_Object::~Am_Object(&local_160);
  Am_Object::~Am_Object(&local_150);
  Am_Point_In_Part(&local_178,0x10d2d8,0x5a,(Am_Object *)0x3c,true,false);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&local_178);
  if (pAVar4 == (Am_Wrapper *)0x0) {
    poVar10 = std::operator<<((ostream *)&std::cout,"No Part of Window at 60x180");
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar10 = std::operator<<((ostream *)&std::cout,"Part of Window at 90x60 is ");
    poVar10 = (ostream *)operator<<(poVar10,&local_178);
    poVar10 = std::operator<<(poVar10," [r2]");
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  }
  Am_Point_In_Leaf(&local_180,0x10d2d8,0xa0,(Am_Object *)0xa0,true,true);
  Am_Object::operator=(&local_178,&local_180);
  Am_Object::~Am_Object(&local_180);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&local_178);
  if (pAVar4 == (Am_Wrapper *)0x0) {
    poVar10 = std::operator<<((ostream *)&std::cout,"No Leaf of Window at 160x160");
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar10 = std::operator<<((ostream *)&std::cout,"Leaf of Window at 160x160 is ");
    poVar10 = (ostream *)operator<<(poVar10,&local_178);
    poVar10 = std::operator<<(poVar10," [eek]");
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  }
  Am_Point_In_Obj((Am_Object *)&y,0x10d300,0x50,(Am_Object *)0x32);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&y);
  Am_Object::~Am_Object((Am_Object *)&y);
  if (pAVar4 == (Am_Wrapper *)0x0) {
    poVar10 = std::operator<<((ostream *)&std::cout,"Window point 90x60 is not in r1");
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar10 = std::operator<<((ostream *)&std::cout,"Window point 90x60 is in r1");
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  }
  Am_Translate_Coordinates(&r2,10,10,&r1,&local_18c,&local_190);
  poVar10 = std::operator<<((ostream *)&std::cout,"Coordinate (10x10) in r2 is coordinate (");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_18c);
  poVar10 = std::operator<<(poVar10,"x");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_190);
  poVar10 = std::operator<<(poVar10,") in r1 [20x20]");
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  Am_Translate_Coordinates(&r2,10,10,&local_90,&local_18c,&local_190);
  poVar10 = std::operator<<((ostream *)&std::cout,"Coordinate (10x10) in r2 is coordinate (");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_18c);
  poVar10 = std::operator<<(poVar10,"x");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_190);
  poVar10 = std::operator<<(poVar10,") in r3 [10x10]");
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  Am_Translate_Coordinates(&eek,10,10,&r1,&local_18c,&local_190);
  poVar10 = std::operator<<((ostream *)&std::cout,"Coordinate (10x10) in eek is coordinate (");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_18c);
  poVar10 = std::operator<<(poVar10,"x");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_190);
  poVar10 = std::operator<<(poVar10,") in r1 [145x155]");
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  Am_Translate_Coordinates(&r4,10,10,&r1,&local_18c,&local_190);
  poVar10 = std::operator<<((ostream *)&std::cout,"Coordinate (10x10) in r4 is coordinate (");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_18c);
  poVar10 = std::operator<<(poVar10,"x");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_190);
  poVar10 = std::operator<<(poVar10,") in r1 [30x160]");
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  print_help();
  if (1 < (int)argv_local) {
    Am_Create_Screen((char *)&local_198);
    Am_Object::operator=(&screen2,&local_198);
    Am_Object::~Am_Object(&local_198);
    pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&screen2);
    if (pAVar4 != (Am_Wrapper *)0x0) {
      Am_Object::Create((char *)&local_1a8);
      uVar2 = Am_Object::Set((ushort)&local_1a8,0x66,200);
      uVar2 = Am_Object::Set(uVar2,0x67,100);
      uVar2 = Am_Object::Set(uVar2,(char *)0x6c,0x10a5fa);
      AVar8.data = (Am_Object_Data *)Am_Object::Set(uVar2,true,1);
      Am_Object::Create((char *)&foo_group);
      uVar2 = Am_Object::Set((ushort)&foo_group,100,0x32);
      uVar2 = Am_Object::Set(uVar2,0x65,0x19);
      uVar2 = Am_Object::Set(uVar2,0x66,100);
      uVar2 = Am_Object::Set(uVar2,0x67,0x32);
      pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Yellow);
      pAVar5 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar4);
      Am_Object::Am_Object(&local_1b0,pAVar5);
      pAVar5 = (Am_Object *)Am_Object::Add_Part(AVar8,SUB81(&local_1b0,0),1);
      Am_Object::Am_Object(&local_1a0,pAVar5);
      Am_Object::Add_Part((Am_Object)0x10d338,SUB81(&local_1a0,0),1);
      Am_Object::~Am_Object(&local_1a0);
      Am_Object::~Am_Object(&local_1b0);
      Am_Object::~Am_Object(&foo_group);
      Am_Object::~Am_Object(&local_1a8);
    }
  }
  Am_Object::Create((char *)&local_1c8);
  AVar1 = PART1;
  Am_Object::Create((char *)&noo_group);
  AVar17.data._2_6_ = 0;
  AVar17.data._0_2_ = AVar1;
  pAVar5 = (Am_Object *)Am_Object::Add_Part((ushort)&local_1c8,AVar17,(ulong)&noo_group);
  Am_Object::Am_Object(&local_1c0,pAVar5);
  Am_Object::~Am_Object(&noo_group);
  Am_Object::~Am_Object(&local_1c8);
  Am_Object::Create((char *)&local_1e0);
  AVar1 = PART1;
  Am_Object::Create((char *)&local_1e8);
  AVar18.data._2_6_ = 0;
  AVar18.data._0_2_ = AVar1;
  pAVar5 = (Am_Object *)Am_Object::Set_Part((ushort)&local_1e0,AVar18,(ulong)&local_1e8);
  Am_Object::Am_Object(&local_1d8,pAVar5);
  Am_Object::~Am_Object(&local_1e8);
  Am_Object::~Am_Object(&local_1e0);
  Am_Main_Event_Loop();
  Am_Cleanup();
  argv_local._4_4_ = 0;
  Am_Object::~Am_Object(&local_1d8);
  Am_Object::~Am_Object(&local_1c0);
  Am_Object::~Am_Object(&local_178);
  Am_Object::~Am_Object(&local_c0);
  Am_Style::~Am_Style(local_a8);
  Am_Object::~Am_Object(&local_90);
  Am_Style::~Am_Style(local_78);
  Am_Point_List::~Am_Point_List(local_68);
  return argv_local._4_4_;
}

Assistant:

int
main(int argc, char **argv)
{
  Am_Initialize();

  window = Am_Window.Create("window")
               .Set(Am_FILL_STYLE, Am_Red)
               .Set(Am_LEFT, 50)
               .Set(Am_TOP, 200)
               .Set(Am_WIDTH, 200)
               .Set(Am_HEIGHT, 220)
               .Set(Am_TITLE, "Test Opal");

  inter = Am_Choice_Interactor.Create("keyboard press");
  inter.Set(Am_START_WHEN, "ANY_KEYBOARD");
  inter.Set(Am_CONTINUOUS, 0);
  inter.Get_Object(Am_COMMAND).Set(Am_DO_METHOD, change_setting);

  window.Add_Part(KEY, inter);

  sw = Am_Window.Create("sub window")
           .Set(Am_FILL_STYLE, Am_Blue)
           .Set(Am_LEFT, 20)
           .Set(Am_TOP, 150)
           .Set(Am_WIDTH, 80)
           .Set(Am_HEIGHT, 60);

  r1 = Am_Rectangle.Create("r1")
           .Set(Am_FILL_STYLE, Am_Green)
           .Set(Am_LEFT, 10)
           .Set(Am_TOP, 10)
           .Set(Am_WIDTH, 180)
           .Set(Am_HEIGHT, 180)
           .Set(Am_WIDTH, rect_width)
           .Set(Am_HEIGHT, rect_height);

  static int tria[8] = {50, 100, 100, 200, 150, 100, 50, 100};
  Am_Point_List triangle(tria, 8);
  t1 = Am_Polygon.Create("triangle").Set(Am_POINT_LIST, triangle);

  Am_Style bevel(0, 0, 0, 30, Am_CAP_BUTT, Am_JOIN_BEVEL);
  r2 = Am_Rectangle.Create("r2")
           .Set(Am_LEFT, 20)
           .Set(Am_TOP, 20)
           .Set(Am_WIDTH, 120)
           .Set(Am_HEIGHT, 90)
           .Set(Am_LINE_STYLE, bevel)
           .Set(Am_FILL_STYLE, Am_Blue);

  Am_Object r3 = Am_Rectangle.Create("r3")
                     .Add(Am_SELECTED, false)
                     .Add(Am_INTERIM_SELECTED, false)
                     .Set(Am_LEFT, 20)
                     .Set(Am_TOP, 20)
                     .Set(Am_WIDTH, 120)
                     .Set(Am_HEIGHT, 90)
                     .Set(Am_FILL_STYLE, rect_fill);

  r4 = Am_Rectangle.Create("r4")
           .Set(Am_LEFT, 10)
           .Set(Am_TOP, 10)
           .Set(Am_WIDTH, 60)
           .Set(Am_HEIGHT, 40)
           .Set(Am_FILL_STYLE, Am_White);

  Am_Style thick_orange_line(0.75, 0.25, 0.0, 5);
  l1 = Am_Line.Create("line1")
           .Set(Am_LINE_STYLE, thick_orange_line)
           .Set(Am_X1, 70)
           .Set(Am_Y1, 15)
           .Set(Am_X2, 145)
           .Set(Am_Y2, 145);
  Am_Object l2 = l1.Create("line2")
                     .Set(Am_X1, at_sw_x)
                     .Set(Am_Y1, at_sw_y)
                     .Set(Am_X2, 145)
                     .Set(Am_Y2, 85);

  g1 = Am_Group.Create("g1")
           .Add_Part(OOK, Am_Rectangle.Create("ook")
                              .Set(Am_LEFT, 0)
                              .Set(Am_TOP, 0)
                              .Set(Am_WIDTH, 50)
                              .Set(Am_HEIGHT, 30)
                              .Set(Am_FILL_STYLE, Am_White))
           .Add_Part(EEK_SLOT, eek = Am_Rectangle.Create("eek")
                                         .Set(Am_FILL_STYLE, Am_Blue)
                                         .Set(Am_LEFT, 5)
                                         .Set(Am_TOP, 5)
                                         .Set(Am_WIDTH, 50)
                                         .Set(Am_HEIGHT, 30))
           .Set(Am_LEFT, 140)
           .Set(Am_TOP, 150)
           .Set(Am_WIDTH, 55)
           .Set(Am_HEIGHT, 35);

  Am_Screen.Add_Part(window);
  window.Add_Part(PART1, r1);
  window.Add_Part(r3);
  window.Add_Part(r2);
  window.Add_Part(LINE1, l1);
  window.Add_Part(l2);
  window.Add_Part(PART2, g1);
  window.Add_Part(PART3, sw);
  window.Add_Part(TRI1, t1);
  sw.Add_Part(r4);

  Am_Screen.Add_Part(
      Am_Window.Create("filter window")
          .Set(Am_TITLE, "Filter Window")
          .Set(Am_FILL_STYLE, Am_Blue)
          .Set(Am_TOP, 40)
          .Add_Part(Am_Group.Create("win parrot")
                        .Set(Am_LEFT, win_parrot_left)
                        .Set(Am_TOP, win_parrot_top)
                        .Set(Am_WIDTH, 500)
                        .Set(Am_HEIGHT, 500)
                        .Add_Part(Am_Rectangle.Create("sub parrot")
                                      .Set(Am_FILL_STYLE, Am_Red)
                                      .Set(Am_LINE_STYLE, (0L))
                                      .Set(Am_LEFT, parrot_left)
                                      .Set(Am_TOP, parrot_top)
                                      .Set(Am_WIDTH, parrot_width)
                                      .Set(Am_HEIGHT, parrot_height))));

  Am_Object object = Am_Point_In_Part(window, 90, 60, window);
  if (object)
    cout << "Part of Window at 90x60 is " << object << " [r2]" << endl;
  else
    cout << "No Part of Window at 60x180" << endl;
  object = Am_Point_In_Leaf(window, 160, 160, window);
  if (object)
    cout << "Leaf of Window at 160x160 is " << object << " [eek]" << endl;
  else
    cout << "No Leaf of Window at 160x160" << endl;
  if (Am_Point_In_Obj(r1, 80, 50, window))
    cout << "Window point 90x60 is in r1" << endl;
  else
    cout << "Window point 90x60 is not in r1" << endl;

  int x, y;
  Am_Translate_Coordinates(r2, 10, 10, r1, x, y);
  cout << "Coordinate (10x10) in r2 is coordinate (" << x << "x" << y
       << ") in r1 [20x20]" << endl;
  Am_Translate_Coordinates(r2, 10, 10, r3, x, y);
  cout << "Coordinate (10x10) in r2 is coordinate (" << x << "x" << y
       << ") in r3 [10x10]" << endl;
  Am_Translate_Coordinates(eek, 10, 10, r1, x, y);
  cout << "Coordinate (10x10) in eek is coordinate (" << x << "x" << y
       << ") in r1 [145x155]" << endl;
  Am_Translate_Coordinates(r4, 10, 10, r1, x, y);
  cout << "Coordinate (10x10) in r4 is coordinate (" << x << "x" << y
       << ") in r1 [30x160]" << endl;

  print_help();

  if (argc > 1) {
    screen2 = Am_Create_Screen(argv[1]);
    if (screen2)
      screen2.Add_Part(Am_Window.Create("other screen")
                           .Set(Am_WIDTH, 200)
                           .Set(Am_HEIGHT, 100)
                           .Set(Am_TITLE, "Another Screen")
                           .Set(Am_QUERY_POSITION, true)
                           .Add_Part(Am_Rectangle.Create("other rectangle")
                                         .Set(Am_LEFT, 50)
                                         .Set(Am_TOP, 25)
                                         .Set(Am_WIDTH, 100)
                                         .Set(Am_HEIGHT, 50)
                                         .Set(Am_FILL_STYLE, Am_Yellow)));
  }

  Am_Object foo_group =
      Am_Group.Create("foo").Add_Part(PART1, Am_Rectangle.Create("bar"));
  Am_Object noo_group =
      foo_group.Create("noo").Set_Part(PART1, Am_Rectangle.Create("bart"));

  Am_Main_Event_Loop();
  Am_Cleanup();

  return 0;
}